

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O3

void __thiscall
HEkkDualRow::chooseFinalLargeAlpha
          (HEkkDualRow *this,HighsInt *breakIndex,HighsInt *breakGroup,HighsInt pass_workCount,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pass_workData,
          vector<int,_std::allocator<int>_> *pass_workGroup)

{
  pointer piVar1;
  pointer piVar2;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (pass_workCount < 1) {
    dVar14 = 0.0;
  }
  else {
    lVar11 = 0;
    dVar13 = 0.0;
    do {
      dVar14 = *(double *)
                ((long)&((pass_workData->
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->second + lVar11);
      if (dVar14 <= dVar13) {
        dVar14 = dVar13;
      }
      lVar11 = lVar11 + 0x10;
      dVar13 = dVar14;
    } while ((ulong)(uint)pass_workCount << 4 != lVar11);
    dVar14 = dVar14 * 0.1;
  }
  piVar1 = (pass_workGroup->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (pass_workGroup->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *breakGroup = -1;
  *breakIndex = -1;
  uVar6 = (int)((ulong)((long)piVar2 - (long)piVar1) >> 2) - 2;
  if (-1 < (int)uVar6) {
    dVar13 = 1.0;
    if (dVar14 <= 1.0) {
      dVar13 = dVar14;
    }
    ppVar3 = (pass_workData->
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = (ulong)uVar6;
    do {
      iVar10 = piVar1[uVar7];
      iVar8 = -1;
      if (iVar10 < piVar1[uVar7 + 1]) {
        lVar11 = (long)piVar1[uVar7 + 1] - (long)iVar10;
        pdVar12 = &ppVar3[iVar10].second;
        dVar14 = 0.0;
        iVar9 = -1;
        do {
          dVar15 = *pdVar12;
          iVar8 = iVar10;
          if (dVar15 <= dVar14) {
            bVar4 = NAN(dVar15);
            bVar5 = dVar14 == dVar15;
            dVar15 = dVar14;
            iVar8 = iVar9;
            if (((bVar5) && (!NAN(dVar14) && !bVar4)) &&
               (iVar8 = iVar10,
               this->workNumTotPermutation[ppVar3[iVar9].first] <=
               this->workNumTotPermutation[((pair<int,_double> *)(pdVar12 + -1))->first])) {
              iVar8 = iVar9;
            }
          }
          pdVar12 = pdVar12 + 2;
          iVar10 = iVar10 + 1;
          lVar11 = lVar11 + -1;
          dVar14 = dVar15;
          iVar9 = iVar8;
        } while (lVar11 != 0);
      }
      if (dVar13 < ppVar3[iVar8].second) {
        *breakIndex = iVar8;
        *breakGroup = (HighsInt)uVar7;
        return;
      }
      bVar4 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void HEkkDualRow::chooseFinalLargeAlpha(
    HighsInt& breakIndex, HighsInt& breakGroup, HighsInt pass_workCount,
    const std::vector<std::pair<HighsInt, double>>& pass_workData,
    const std::vector<HighsInt>& pass_workGroup) {
  double finalCompare = 0;
  for (HighsInt i = 0; i < pass_workCount; i++)
    finalCompare = max(finalCompare, pass_workData[i].second);
  finalCompare = min(0.1 * finalCompare, 1.0);
  HighsInt countGroup = pass_workGroup.size() - 1;
  breakGroup = -1;
  breakIndex = -1;
  for (HighsInt iGroup = countGroup - 1; iGroup >= 0; iGroup--) {
    double dMaxFinal = 0;
    HighsInt iMaxFinal = -1;
    for (HighsInt i = pass_workGroup[iGroup]; i < pass_workGroup[iGroup + 1];
         i++) {
      if (dMaxFinal < pass_workData[i].second) {
        dMaxFinal = pass_workData[i].second;
        iMaxFinal = i;
      } else if (dMaxFinal == pass_workData[i].second) {
        HighsInt jCol = pass_workData[iMaxFinal].first;
        HighsInt iCol = pass_workData[i].first;
        if (workNumTotPermutation[iCol] < workNumTotPermutation[jCol]) {
          iMaxFinal = i;
        }
      }
    }

    if (pass_workData[iMaxFinal].second > finalCompare) {
      breakIndex = iMaxFinal;
      breakGroup = iGroup;
      break;
    }
  }
}